

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<long_long,unsigned_int>(void)

{
  long lVar1;
  long lVar2;
  uint64_t tmp_5;
  int64_t tmp;
  int64_t t1;
  int64_t tmp_1;
  int64_t local_40;
  int64_t local_38;
  longlong local_30;
  int64_t local_28;
  
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  LargeIntRegMultiply<long,unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38,0,&local_40);
  local_38 = local_30;
  local_40 = 0;
  local_28 = 0;
  LargeIntRegMultiply<long,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38,&local_40,&local_28);
  local_38 = local_30;
  local_40 = 0;
  LargeIntRegMultiply<long,unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38,0,&local_40);
  local_38 = local_30;
  local_40 = 0;
  LargeIntRegMultiply<long,unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38,0,&local_40);
  local_30 = local_40;
  local_38 = local_40;
  local_40 = 0;
  LargeIntRegMultiply<long,unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38,0,&local_40);
  local_30 = 1;
  local_38 = 0;
  local_40 = 1;
  DivisionHelper<long_long,long_long,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_30,&local_40,&local_38);
  if (local_30 == 0) {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  if (local_30 != 0x7fffffffffffffff) {
    local_38 = 0;
    local_40 = 1;
    AdditionHelper<long_long,long_long,10>::
    AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_30,&local_40,&local_38);
    if ((local_30 != 0x7fffffffffffffff) &&
       (lVar1 = local_30 + 1, lVar2 = local_30 + 2, local_30 = lVar1, lVar1 <= lVar2)) {
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}